

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareDoubleOrFloat<double>
          (SimpleFieldComparator *this,FieldDescriptor *field,double value_1,double value_2)

{
  pointer prVar1;
  byte bVar2;
  Tolerance *pTVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  iterator it;
  iterator local_30;
  iterator local_20;
  
  if ((value_1 == value_2) && (!NAN(value_1) && !NAN(value_2))) {
    return true;
  }
  bVar4 = this->float_comparison_ != EXACT;
  bVar2 = (NAN(value_2) && NAN(value_1)) & this->treat_nan_as_equal_;
  if (!bVar4 || bVar2 != 0) {
    return (bool)(bVar4 | bVar2);
  }
  pTVar3 = (Tolerance *)0x0;
  if (this->has_default_tolerance_ != false) {
    pTVar3 = &this->default_tolerance_;
  }
  local_30.ctrl_ = (ctrl_t *)field;
  local_20 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
                         *)&this->map_tolerance_,
                        (key_arg<const_google::protobuf::FieldDescriptor_*> *)&local_30);
  local_30.ctrl_ = (ctrl_t *)0x0;
  bVar4 = absl::lts_20240722::container_internal::operator==(&local_20,&local_30);
  if (!bVar4) {
    prVar1 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
             ::iterator::operator->(&local_20);
    pTVar3 = &prVar1->second;
  }
  if (pTVar3 == (Tolerance *)0x0) {
    dVar6 = ABS(value_1);
    dVar5 = ABS(value_2);
    if ((7.105427357601002e-15 < dVar6) || (bVar4 = true, 7.105427357601002e-15 < dVar5)) {
      if ((ulong)ABS(value_2) < 0x7ff0000000000000 && (ulong)ABS(value_1) < 0x7ff0000000000000) {
        if (dVar5 <= dVar6) {
          dVar5 = dVar6;
        }
        dVar5 = dVar5 * 7.105427357601002e-15;
        if (dVar5 <= 7.105427357601002e-15) {
          dVar5 = 7.105427357601002e-15;
        }
        bVar4 = ABS(value_1 - value_2) <= dVar5;
      }
      else {
        bVar4 = false;
      }
    }
  }
  else {
    bVar4 = anon_unknown_4::WithinFractionOrMargin<double>
                      (value_1,value_2,pTVar3->fraction,pTVar3->margin);
  }
  return bVar4;
}

Assistant:

bool SimpleFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                 T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = nullptr;
    if (has_default_tolerance_) tolerance = &default_tolerance_;

    auto it = map_tolerance_.find(&field);
    if (it != map_tolerance_.end()) {
      tolerance = &it->second;
    }

    if (tolerance != nullptr) {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return WithinFractionOrMargin(value_1, value_2,
                                    static_cast<T>(tolerance->fraction),
                                    static_cast<T>(tolerance->margin));
    } else {
      if (std::fabs(value_1) <= Epsilon<T>::value &&
          std::fabs(value_2) <= Epsilon<T>::value) {
        return true;
      }
      return WithinFractionOrMargin(value_1, value_2, Epsilon<T>::value,
                                    Epsilon<T>::value);
    }
  }
}